

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

_Bool verify_object(char *prompt,object *obj,player *p)

{
  _Bool _Var1;
  char o_name [80];
  char out_val [160];
  char acStack_108 [80];
  char local_b8 [160];
  
  object_desc(acStack_108,0x50,obj,0x43,p);
  strnfmt(local_b8,0xa0,"%s %s? ",prompt,acStack_108);
  _Var1 = get_check(local_b8);
  return _Var1;
}

Assistant:

bool verify_object(const char *prompt, const struct object *obj,
		const struct player *p)
{
	char o_name[80];

	char out_val[160];

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL, p);

	/* Prompt */
	strnfmt(out_val, sizeof(out_val), "%s %s? ", prompt, o_name);

	/* Query */
	return (get_check(out_val));
}